

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PFloat::SetSymbols(PFloat *this,SymbolInitI *sym,size_t count)

{
  FName local_2c;
  ulong local_28;
  size_t i;
  size_t count_local;
  SymbolInitI *sym_local;
  PFloat *this_local;
  
  i = count;
  count_local = (size_t)sym;
  sym_local = (SymbolInitI *)this;
  for (local_28 = 0; local_28 < i; local_28 = local_28 + 1) {
    sym = (SymbolInitI *)DObject::operator_new((DObject *)0x38,(size_t)sym);
    FName::FName(&local_2c,*(ENamedName *)(count_local + local_28 * 8));
    PSymbolConstNumeric::PSymbolConstNumeric
              ((PSymbolConstNumeric *)sym,&local_2c,(PType *)this,
               *(int *)(count_local + 4 + local_28 * 8));
    PSymbolTable::AddSymbol(&(this->super_PBasicType).super_PType.Symbols,(PSymbol *)sym);
  }
  return;
}

Assistant:

void PFloat::SetSymbols(const PFloat::SymbolInitI *sym, size_t count)
{
	for (size_t i = 0; i < count; ++i)
	{
		Symbols.AddSymbol(new PSymbolConstNumeric(sym[i].Name, this, sym[i].Value));
	}
}